

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

char * getcontent(xmlNode *attr)

{
  char *pcVar1;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  size_t sVar4;
  char *pcVar5;
  ushort **ppuVar6;
  _xmlNode **pp_Var7;
  xmlChar *__s;
  long lVar8;
  _xmlNode **pp_Var9;
  char *__dest;
  char *pcVar10;
  
  lVar8 = 0;
  pp_Var7 = &attr->children;
  pp_Var9 = pp_Var7;
  while (p_Var3 = *pp_Var9, p_Var3 != (_xmlNode *)0x0) {
    if (p_Var3->type == XML_TEXT_NODE) {
      sVar4 = strlen((char *)p_Var3->content);
      lVar8 = lVar8 + sVar4;
    }
    pp_Var9 = &p_Var3->next;
  }
  pcVar5 = (char *)malloc(lVar8 + 1);
  __dest = pcVar5;
  while (p_Var3 = *pp_Var7, p_Var3 != (_xmlNode *)0x0) {
    if (p_Var3->type == XML_TEXT_NODE) {
      __s = p_Var3->content;
      if (__dest == pcVar5) {
        ppuVar6 = __ctype_b_loc();
        __s = __s + -1;
        do {
          pxVar2 = __s + 1;
          __s = __s + 1;
        } while ((*(byte *)((long)*ppuVar6 + (long)(char)*pxVar2 * 2 + 1) & 0x20) != 0);
      }
      sVar4 = strlen((char *)__s);
      memcpy(__dest,__s,sVar4);
      __dest = __dest + sVar4;
    }
    pp_Var7 = &p_Var3->next;
  }
  do {
    pcVar10 = pcVar5;
    if (__dest == pcVar5) break;
    ppuVar6 = __ctype_b_loc();
    pcVar1 = __dest + -1;
    pcVar10 = __dest;
    __dest = __dest + -1;
  } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
  *pcVar10 = '\0';
  return pcVar5;
}

Assistant:

static char *getcontent (xmlNode *attr) {
	xmlNode *chain = attr->children;
	size_t size = 0;
	char *content, *p;
	while (chain) {
		if (chain->type == XML_TEXT_NODE)
			size += strlen(chain->content);
		chain = chain->next;
	}
	p = content = malloc(size + 1);
	chain = attr->children;
	while (chain) {
		if (chain->type == XML_TEXT_NODE) {
			char* sp = chain->content;
			if(p == content) {
				while(isspace(*sp))
					++sp;
			}
			size_t len = strlen(sp);
			memcpy(p, sp, len);
			p += len;
		}
		chain = chain->next;
	}
	while(p != content && isspace(p[-1]))
		--p;
	*p = 0;
	return content;
}